

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error __thiscall
llvm::Expected<llvm::DWARFDebugNames::Entry>::takeError
          (Expected<llvm::DWARFDebugNames::Entry> *this)

{
  error_type *peVar1;
  Expected<llvm::DWARFDebugNames::Entry> *in_RSI;
  Error local_40 [3];
  byte local_21;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_20 [2];
  Expected<llvm::DWARFDebugNames::Entry> *this_local;
  
  local_21 = 0;
  this_local = this;
  if ((in_RSI->field_0xb8 & 1) == 0) {
    Error::success();
    Error::Error((Error *)this,local_40);
    ErrorSuccess::~ErrorSuccess((ErrorSuccess *)local_40);
  }
  else {
    peVar1 = getErrorStorage(in_RSI);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (local_20,peVar1);
    local_21 = 1;
    Error::Error((Error *)this,local_20);
  }
  if ((local_21 & 1) != 0) {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (local_20);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error takeError() {
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
    Unchecked = false;
#endif
    return HasError ? Error(std::move(*getErrorStorage())) : Error::success();
  }